

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O2

void __thiscall miniros::master::RegistrationManager::RegistrationManager(RegistrationManager *this)

{
  _Rb_tree_header *p_Var1;
  
  Registrations::Registrations(&this->publishers,TOPIC_PUBLICATIONS);
  Registrations::Registrations(&this->subscribers,TOPIC_SUBSCRIPTIONS);
  Registrations::Registrations(&this->services,SERVICE);
  *(undefined8 *)((long)&(this->m_guard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_guard).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_guard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_guard).super___mutex_base._M_mutex + 8) = 0;
  (this->m_guard).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_nodesToShutdown)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Registrations::Registrations(&this->param_subscribers,PARAM_SUBSCRIPTIONS);
  return;
}

Assistant:

RegistrationManager::RegistrationManager()
  : publishers(Registrations::TOPIC_PUBLICATIONS)
  , subscribers(Registrations::TOPIC_SUBSCRIPTIONS)
  , services(Registrations::SERVICE)
  , param_subscribers(Registrations::PARAM_SUBSCRIPTIONS)
{
}